

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::uploadImageAspect
          (CopiesAndBlittingTestInstance *this,ConstPixelBufferAccess *imageAccess,VkImage *image,
          ImageParms *parms)

{
  Move<vk::VkCommandBuffer_s_*> *cmdBuffer;
  int iVar1;
  int iVar2;
  int iVar3;
  ChannelOrder CVar4;
  ConstPixelBufferAccess *pCVar5;
  Handle<(vk::HandleType)8> HVar6;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  VkAllocationCallbacks *pVVar9;
  CopiesAndBlittingTestInstance *this_00;
  bool bVar10;
  int iVar11;
  VkResult VVar12;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar13;
  TextureFormat TVar14;
  deUint32 dVar15;
  deUint32 dVar16;
  ulong uVar17;
  VkBufferCreateInfo *pVVar18;
  bool bVar19;
  deUint32 queueFamilyIndex;
  VkBuffer local_1b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1b0;
  ConstPixelBufferAccess *local_198;
  VkImage *local_190;
  Move<vk::Handle<(vk::HandleType)8>_> local_188;
  deUint64 local_168;
  undefined8 local_160;
  ulong local_158;
  undefined1 local_148 [16];
  undefined8 local_138;
  VkAllocationCallbacks *pVStack_130;
  undefined8 local_128;
  deUint64 local_120;
  int local_118;
  undefined8 local_114;
  undefined4 local_10c;
  deUint32 local_108;
  ulong local_100;
  VkQueue local_f8;
  CopiesAndBlittingTestInstance *local_f0;
  ulong local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  int local_c8;
  undefined8 local_c4;
  deUint32 local_bc;
  undefined8 local_b8;
  undefined4 local_b0;
  undefined8 local_ac;
  deUint32 local_a4;
  VkBufferCreateInfo bufferParams;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  local_190 = image;
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_f8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pAVar13 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  DStack_1b0.m_device = (VkDevice)0x0;
  DStack_1b0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_1b8.m_internal = 0;
  DStack_1b0.m_deviceIface = (DeviceInterface *)0x0;
  iVar1 = (imageAccess->m_size).m_data[0];
  iVar2 = (imageAccess->m_size).m_data[1];
  iVar3 = (imageAccess->m_size).m_data[2];
  local_198 = imageAccess;
  iVar11 = tcu::getPixelSize(imageAccess->m_format);
  uVar17 = (ulong)(uint)(iVar3 * iVar11 * iVar2 * iVar1);
  dVar15 = (parms->extent).depth;
  bVar19 = parms->imageType == VK_IMAGE_TYPE_2D;
  dVar16 = 1;
  if (bVar19) {
    dVar16 = dVar15;
  }
  local_e0._0_4_ = (parms->extent).width;
  local_e0._4_4_ = (parms->extent).height;
  if (bVar19) {
    dVar15 = 1;
  }
  bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferParams.pNext = (void *)0x0;
  bufferParams._16_8_ = (ulong)(uint)bufferParams._20_4_ << 0x20;
  bufferParams.usage = 1;
  bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferParams.queueFamilyIndexCount = 1;
  bufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  bufferParams.size = uVar17;
  ::vk::createBuffer(&local_188,vk,device,&bufferParams,(VkAllocationCallbacks *)0x0);
  pVVar9 = local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pVVar8 = local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pDVar7 = local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_138 = local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_130 = local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_148._0_8_ = local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  local_148._8_8_ =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_1b8.m_internal == 0) {
    DStack_1b0.m_device = pVVar8;
    DStack_1b0.m_allocator = pVVar9;
    local_1b8.m_internal = HVar6.m_internal;
    DStack_1b0.m_deviceIface = pDVar7;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_1b0,local_1b8);
    local_1b8.m_internal = local_148._0_8_;
    DStack_1b0.m_deviceIface = (DeviceInterface *)local_148._8_8_;
    DStack_1b0.m_device = local_138;
    DStack_1b0.m_allocator = pVStack_130;
    if (local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                 (VkBuffer)
                 local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  ::vk::getBufferMemoryRequirements((VkMemoryRequirements *)local_148,vk,device,local_1b8);
  (*pAVar13->_vptr_Allocator[3])(&local_188,pAVar13,local_148,1);
  HVar6.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  VVar12 = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,local_1b8.m_internal,
                      *(long *)(local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                object.m_internal + 8),
                      *(long *)(local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                object.m_internal + 0x10));
  ::vk::checkResult(VVar12,
                    "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x16c);
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ = 0x2c;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x80000004000;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0xffffffffffffffff;
  local_168 = local_1b8.m_internal;
  local_160 = 0;
  local_158 = uVar17;
  local_f0 = this;
  local_e8 = uVar17;
  TVar14 = ::vk::mapVkFormat(parms->format);
  bVar19 = tcu::hasDepthComponent(TVar14.order);
  bVar10 = tcu::hasStencilComponent(TVar14.order);
  iVar1 = (uint)bVar19 * 2 + (uint)bVar10 * 4;
  local_118 = iVar1 + (uint)(iVar1 == 0);
  local_100 = 0;
  if (iVar1 == 6) {
    CVar4 = (local_198->m_format).order;
    bVar19 = tcu::hasDepthComponent(CVar4);
    bVar10 = tcu::hasStencilComponent(CVar4);
    local_100 = (ulong)((char)(bVar19 * '\x02' + bVar10 * '\x04') == '\x04');
  }
  pCVar5 = local_198;
  bufferParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  bufferParams.pNext = (void *)0x0;
  bufferParams.flags = 0;
  bufferParams._20_4_ = 0x1000;
  bufferParams.size = 0x700000000;
  bufferParams.usage = 0xffffffff;
  bufferParams.sharingMode = ~VK_SHARING_MODE_EXCLUSIVE;
  local_120 = local_190->m_internal;
  bufferParams.pQueueFamilyIndices._4_4_ = 0;
  local_148._0_4_ = 0x2d;
  local_148._8_8_ = 0;
  local_138._0_4_ = 0x1000;
  local_138._4_4_ = 0x1000;
  pVStack_130 = (VkAllocationCallbacks *)0x700000007;
  local_128 = 0xffffffffffffffff;
  local_114 = 0x100000000;
  local_10c = 0;
  local_d8 = 0;
  local_d0 = *(undefined8 *)(local_198->m_size).m_data;
  CVar4 = (local_198->m_format).order;
  local_108 = dVar16;
  bufferParams._40_8_ = local_120;
  bufferParams.pQueueFamilyIndices._0_4_ = local_118;
  bVar19 = tcu::hasDepthComponent(CVar4);
  bVar10 = tcu::hasStencilComponent(CVar4);
  uVar17 = local_e8;
  local_c8 = (uint)bVar19 * 2 + (uint)bVar10 * 4;
  local_c8 = local_c8 + (uint)(local_c8 == 0);
  local_c4 = 0;
  local_b8 = 0;
  local_b0 = 0;
  local_ac = local_e0;
  local_bc = dVar16;
  local_a4 = dVar15;
  memcpy(*(void **)(HVar6.m_internal + 0x18),pCVar5->m_data,local_e8);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)*(deUint64 *)(HVar6.m_internal + 8),
             *(VkDeviceSize *)(HVar6.m_internal + 0x10),uVar17);
  this_00 = local_f0;
  VVar12 = (*vk->_vptr_DeviceInterface[0x49])
                     (vk,(local_f0->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                         object);
  ::vk::checkResult(VVar12,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c4);
  cmdBuffer = &this_00->m_cmdBuffer;
  pVVar18 = &bufferParams;
  if ((byte)local_100 != 0) {
    pVVar18 = (VkBufferCreateInfo *)0x0;
  }
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x4000,0x1000,0,0,
             0,1,&local_188,(ulong)(byte)((byte)local_100 ^ 1),pVVar18);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,
             local_1b8.m_internal,local_190->m_internal,7,1,&local_d8);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x1000,1,0,0,0,0,0
             ,1,local_148);
  VVar12 = (*vk->_vptr_DeviceInterface[0x4a])
                     (vk,(cmdBuffer->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(VVar12,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCopiesAndBlittingTests.cpp"
                    ,0x1c9);
  submitCommandsAndWait(this_00,vk,device,local_f8,(VkCommandBuffer *)cmdBuffer);
  (**(code **)(*(long *)HVar6.m_internal + 8))(HVar6.m_internal);
  if (local_1b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_1b0,local_1b8);
  }
  return;
}

Assistant:

void CopiesAndBlittingTestInstance::uploadImageAspect (const tcu::ConstPixelBufferAccess& imageAccess, const VkImage& image, const ImageParms& parms)
{
	const DeviceInterface&		vk					= m_context.getDeviceInterface();
	const VkDevice				vkDevice			= m_context.getDevice();
	const VkQueue				queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&					memAlloc			= m_context.getDefaultAllocator();
	Move<VkBuffer>				buffer;
	const deUint32				bufferSize			= calculateSize(imageAccess);
	de::MovePtr<Allocation>		bufferAlloc;
	const deUint32				arraySize			= getArraySize(parms);
	const VkExtent3D			imageExtent			= getExtent3D(parms);

	// Create source buffer
	{
		const VkBufferCreateInfo			bufferParams			=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			bufferSize,									// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		buffer		= createBuffer(vk, vkDevice, &bufferParams);
		bufferAlloc = memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));
	}

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier				preBufferBarrier		=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType	sType;
		DE_NULL,										// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,						// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32			dstQueueFamilyIndex;
		*buffer,										// VkBuffer			buffer;
		0u,												// VkDeviceSize		offset;
		bufferSize										// VkDeviceSize		size;
	};

	const VkImageAspectFlags				formatAspect			= getAspectFlags(mapVkFormat(parms.format));
	const bool								skipPreImageBarrier		= formatAspect == (VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT) &&
																	  getAspectFlags(imageAccess.getFormat()) == VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageMemoryBarrier				preImageBarrier			=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,	// VkImageAspectFlags	aspect;
			0u,				// deUint32				baseMipLevel;
			1u,				// deUint32				mipLevels;
			0u,				// deUint32				baseArraySlice;
			arraySize,		// deUint32				arraySize;
		}
	};

	const VkImageMemoryBarrier				postImageBarrier		=
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		image,											// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			formatAspect,				// VkImageAspectFlags	aspect;
			0u,							// deUint32				baseMipLevel;
			1u,							// deUint32				mipLevels;
			0u,							// deUint32				baseArraySlice;
			arraySize,					// deUint32				arraySize;
		}
	};

	const VkBufferImageCopy		copyRegion		=
	{
		0u,												// VkDeviceSize				bufferOffset;
		(deUint32)imageAccess.getWidth(),				// deUint32					bufferRowLength;
		(deUint32)imageAccess.getHeight(),				// deUint32					bufferImageHeight;
		{
			getAspectFlags(imageAccess.getFormat()),		// VkImageAspectFlags	aspect;
			0u,												// deUint32				mipLevel;
			0u,												// deUint32				baseArrayLayer;
			arraySize,										// deUint32				layerCount;
		},												// VkImageSubresourceLayers	imageSubresource;
		{ 0, 0, 0 },									// VkOffset3D				imageOffset;
		imageExtent										// VkExtent3D				imageExtent;
	};

	// Write buffer data
	deMemcpy(bufferAlloc->getHostPtr(), imageAccess.getDataPtr(), bufferSize);
	flushMappedMemoryRange(vk, vkDevice, bufferAlloc->getMemory(), bufferAlloc->getOffset(), bufferSize);

	// Copy buffer to image
	const VkCommandBufferBeginInfo			cmdBufferBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// VkStructureType					sType;
		DE_NULL,												// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,			// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL,
						  1, &preBufferBarrier, (skipPreImageBarrier ? 0 : 1), (skipPreImageBarrier ? DE_NULL : &preImageBarrier));
	vk.cmdCopyBufferToImage(*m_cmdBuffer, *buffer, image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyRegion);
	vk.cmdPipelineBarrier(*m_cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));

	submitCommandsAndWait(vk, vkDevice, queue, *m_cmdBuffer);
}